

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_stream_test.c
# Opt level: O0

void test_tcp_listen_activation_closed(void)

{
  nng_err nVar1;
  int iVar2;
  nng_err num;
  char *pcVar3;
  char *pcVar4;
  nng_err result__4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  int fd;
  nng_stream_listener *l2;
  nng_stream_listener *l1;
  
  nVar1 = nng_stream_listener_alloc(&l2,"tcp://");
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x177,"%s: expected success, got %s (%d)",
                         "nng_stream_listener_alloc(&l1, \"tcp://\")",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_stream_listener_alloc((nng_stream_listener **)&result_,"tcp://");
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x178,"%s: expected success, got %s (%d)",
                         "nng_stream_listener_alloc(&l2, \"tcp://\")",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_stream_listener_listen(_result_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x179,"%s: expected success, got %s (%d)","nng_stream_listener_listen(l2)"
                         ,pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_stream_listener_get_int(_result_,"listen-fd",(int *)&result__1);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                         ,0x17a,"%s: expected success, got %s (%d)",
                         "nng_stream_listener_get_int(l2, NNG_OPT_LISTEN_FD, &fd)",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nng_stream_listener_close(l2);
  num = nng_stream_listener_set_int(l2,"listen-fd",result__1);
  pcVar3 = nng_strerror(NNG_ECLOSED);
  acutest_check_((uint)(num == NNG_ECLOSED),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/platform/tcp_stream_test.c"
                 ,0x17d,"%s fails with %s","nng_stream_listener_set_int(l1, NNG_OPT_LISTEN_FD, fd)",
                 pcVar3,nVar1);
  pcVar3 = nng_strerror(NNG_ECLOSED);
  pcVar4 = nng_strerror(num);
  acutest_message_("%s: expected %s (%d), got %s (%d)",
                   "nng_stream_listener_set_int(l1, NNG_OPT_LISTEN_FD, fd)",pcVar3,7,pcVar4,
                   (ulong)num);
  nng_stream_listener_free(l2);
  nng_stream_listener_free(_result_);
  return;
}

Assistant:

void
test_tcp_listen_activation_closed(void)
{
	nng_stream_listener *l1;
	nng_stream_listener *l2;
	int                  fd;

	NUTS_PASS(nng_stream_listener_alloc(&l1, "tcp://"));
	NUTS_PASS(nng_stream_listener_alloc(&l2, "tcp://"));
	NUTS_PASS(nng_stream_listener_listen(l2));
	NUTS_PASS(nng_stream_listener_get_int(l2, NNG_OPT_LISTEN_FD, &fd));
	nng_stream_listener_close(l1);
	NUTS_FAIL(nng_stream_listener_set_int(l1, NNG_OPT_LISTEN_FD, fd),
	    NNG_ECLOSED);
	nng_stream_listener_free(l1);
	nng_stream_listener_free(l2);
}